

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint llvm::dwarf::OperationVendor(LocationAtom Op)

{
  if ((int)Op < 0xf3) {
    if (Op != DW_OP_GNU_push_tls_address) {
      if (Op != DW_OP_WASM_location) {
        return 0;
      }
      return 7;
    }
  }
  else if (((Op != DW_OP_GNU_entry_value) && (Op != DW_OP_GNU_addr_index)) &&
          (Op != DW_OP_GNU_const_index)) {
    return 0;
  }
  return 3;
}

Assistant:

unsigned llvm::dwarf::OperationVendor(dwarf::LocationAtom Op) {
  switch (Op) {
  default:
    return 0;
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  case DW_OP_##NAME:                                                           \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}